

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

Address * cfd::core::Address::GetPegoutAddress
                    (Address *__return_storage_ptr__,NetType_conflict type,Script *locking_script,
                    vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                    *network_parameters)

{
  bool bVar1;
  CfdException *pCVar2;
  ByteData hash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> items;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> list;
  Script pegout_locking_script;
  
  Script::GetElementList(&list,locking_script);
  bVar1 = Script::IsPegoutScript(locking_script);
  if (bVar1) {
    if (2 < (ulong)(((long)list.
                           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)list.
                          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x60)) {
      ScriptElement::GetBinaryData
                (&hash,list.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_start + 2);
      Script::Script(&pegout_locking_script,&hash);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash);
      Script::GetElementList(&items,&pegout_locking_script);
      bVar1 = Script::IsP2wpkhScript(&pegout_locking_script);
      if (bVar1) {
        ScriptElement::GetBinaryData
                  (&hash,items.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
        Address(__return_storage_ptr__,type,kVersion0,&hash,network_parameters);
      }
      else {
        bVar1 = Script::IsTaprootScript(&pegout_locking_script);
        if (bVar1) {
          ScriptElement::GetBinaryData
                    (&hash,items.
                           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1);
          Address(__return_storage_ptr__,type,kVersion1,&hash,network_parameters);
        }
        else {
          bVar1 = Script::IsP2pkhScript(&pegout_locking_script);
          if (bVar1) {
            ScriptElement::GetBinaryData
                      ((ByteData *)&local_a0,
                       items.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_start + 2);
            ByteData160::ByteData160((ByteData160 *)&hash,(ByteData *)&local_a0);
            ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_a0);
            Address(__return_storage_ptr__,type,kP2pkhAddress,(ByteData160 *)&hash,
                    network_parameters);
          }
          else {
            bVar1 = Script::IsP2shScript(&pegout_locking_script);
            if (!bVar1) {
              pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
              ::std::__cxx11::string::string
                        ((string *)&hash,
                         "Invalid pegout script. This script is unsupported by pegout address.",
                         (allocator *)&local_a0);
              CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&hash);
              __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
            }
            ScriptElement::GetBinaryData
                      ((ByteData *)&local_a0,
                       items.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
            ByteData160::ByteData160((ByteData160 *)&hash,(ByteData *)&local_a0);
            ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_a0);
            Address(__return_storage_ptr__,type,kP2shAddress,(ByteData160 *)&hash,network_parameters
                   );
          }
        }
      }
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash);
      ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                (&items);
      Script::~Script(&pegout_locking_script);
      ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                (&list);
      return __return_storage_ptr__;
    }
  }
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&pegout_locking_script,
             "Invalid pegout script. This script have not a pegout address.",(allocator *)&hash);
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&pegout_locking_script);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Address Address::GetPegoutAddress(
    NetType type, const Script& locking_script,
    const std::vector<AddressFormatData>& network_parameters) {
  auto list = locking_script.GetElementList();
  if ((!locking_script.IsPegoutScript()) || (list.size() <= 2)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid pegout script. This script have not a pegout address.");
  }

  Script pegout_locking_script = Script(list[2].GetBinaryData());
  auto items = pegout_locking_script.GetElementList();
  if (pegout_locking_script.IsP2wpkhScript()) {
    ByteData hash(items[1].GetBinaryData());
    return Address(type, WitnessVersion::kVersion0, hash, network_parameters);
  } else if (pegout_locking_script.IsTaprootScript()) {
    ByteData hash(items[1].GetBinaryData());
    return Address(type, WitnessVersion::kVersion1, hash, network_parameters);
  } else if (pegout_locking_script.IsP2pkhScript()) {
    ByteData160 hash(items[2].GetBinaryData());
    return Address(type, AddressType::kP2pkhAddress, hash, network_parameters);
  } else if (pegout_locking_script.IsP2shScript()) {
    ByteData160 hash(items[1].GetBinaryData());
    return Address(type, AddressType::kP2shAddress, hash, network_parameters);
  } else {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid pegout script. This script is unsupported by pegout "
        "address.");
  }
}